

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Get
          (PersistentStorageJson *this,RegistrarId *aId,BorderRouter *aRetValue)

{
  uint32_t *puVar1;
  byte *pbVar2;
  Status SVar3;
  int iVar4;
  Domain dom;
  Network nwk;
  undefined1 local_d0 [16];
  size_type local_c0;
  string local_a8;
  Network local_88;
  
  std::__cxx11::string::string((string *)&local_a8,(string *)JSON_BR_abi_cxx11_);
  SVar3 = GetId<ot::commissioner::persistent_storage::BorderRouter,ot::commissioner::persistent_storage::BorderRouterId>
                    (this,aId,aRetValue,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (SVar3 == kSuccess) {
    if ((aRetValue->mNetworkId).mId == 0xffffffff) {
      SVar3 = kSuccess;
    }
    else {
      Network::Network(&local_88);
      iVar4 = (*(this->super_PersistentStorage)._vptr_PersistentStorage[0xe])
                        (this,&aRetValue->mNetworkId,&local_88);
      SVar3 = (Status)iVar4;
      if (SVar3 == kSuccess) {
        if (local_88.mName._M_string_length != 0) {
          std::__cxx11::string::_M_assign((string *)&(aRetValue->mAgent).mNetworkName);
          puVar1 = &(aRetValue->mAgent).mPresentFlags;
          *(byte *)puVar1 = (byte)*puVar1 | 0x10;
        }
        if (local_88.mXpan != 0) {
          (aRetValue->mAgent).mExtendedPanId = local_88.mXpan;
          puVar1 = &(aRetValue->mAgent).mPresentFlags;
          *(byte *)puVar1 = (byte)*puVar1 | 0x20;
        }
        if (local_88.mDomainId.mId == 0xffffffff) {
          SVar3 = kSuccess;
        }
        else {
          Domain::Domain((Domain *)local_d0);
          iVar4 = (*(this->super_PersistentStorage)._vptr_PersistentStorage[0xd])
                            (this,&local_88.mDomainId,local_d0);
          SVar3 = (Status)iVar4;
          if ((SVar3 == kSuccess) && (local_c0 != 0)) {
            std::__cxx11::string::_M_assign((string *)&(aRetValue->mAgent).mDomainName);
            pbVar2 = (byte *)((long)&(aRetValue->mAgent).mPresentFlags + 1);
            *pbVar2 = *pbVar2 | 0x10;
          }
          std::__cxx11::string::~string((string *)(local_d0 + 8));
        }
      }
      Network::~Network(&local_88);
    }
  }
  return SVar3;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Get(BorderRouterId const &aId, BorderRouter &aRetValue)
{
    Status status = GetId<BorderRouter, BorderRouterId>(aId, aRetValue, JSON_BR);

    if (status == Status::kSuccess && aRetValue.mNetworkId.mId != EMPTY_ID)
    {
        Network nwk;
        status = Get(aRetValue.mNetworkId, nwk);
        if (status == Status::kSuccess)
        {
            if (!nwk.mName.empty())
            {
                aRetValue.mAgent.mNetworkName = nwk.mName;
                aRetValue.mAgent.mPresentFlags |= BorderAgent::kNetworkNameBit;
            }
            if (nwk.mXpan != 0)
            {
                aRetValue.mAgent.mExtendedPanId = nwk.mXpan;
                aRetValue.mAgent.mPresentFlags |= BorderAgent::kExtendedPanIdBit;
            }
            if (nwk.mDomainId.mId != EMPTY_ID)
            {
                Domain dom;
                status = Get(nwk.mDomainId, dom);
                if (status == Status::kSuccess && !dom.mName.empty())
                {
                    aRetValue.mAgent.mDomainName = dom.mName;
                    aRetValue.mAgent.mPresentFlags |= BorderAgent::kDomainNameBit;
                }
            }
        }
    }

    return status;
}